

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwidgettextcontrol.cpp
# Opt level: O0

void __thiscall
QWidgetTextControlPrivate::extendBlockwiseSelection
          (QWidgetTextControlPrivate *this,int suggestedNewPosition)

{
  int iVar1;
  int iVar2;
  MoveMode MVar3;
  Int IVar4;
  QWidgetTextControl *this_00;
  MoveMode in_ESI;
  QWidgetTextControlPrivate *in_RDI;
  long in_FS_OFFSET;
  QWidgetTextControl *q;
  TextInteractionFlag in_stack_ffffffffffffffac;
  QTextCursor *in_stack_ffffffffffffffb0;
  MoveMode MVar5;
  MoveMode in_stack_ffffffffffffffc4;
  MoveMode MVar6;
  undefined4 in_stack_ffffffffffffffd0;
  undefined1 forceEmitSelectionChanged;
  QWidgetTextControlPrivate *this_01;
  QFlagsStorageHelper<Qt::TextInteractionFlag,_4> local_c;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  this_01 = in_RDI;
  this_00 = q_func(in_RDI);
  MVar6 = in_ESI;
  iVar1 = QTextCursor::selectionStart();
  MVar5 = MVar6;
  if (iVar1 <= (int)in_ESI) {
    iVar1 = QTextCursor::selectionEnd();
    in_stack_ffffffffffffffc4 = MVar6;
    if ((int)MVar6 <= iVar1) {
      QWidgetTextControl::setTextCursor
                (this_00,(QTextCursor *)CONCAT44(in_ESI,in_stack_ffffffffffffffd0),
                 SUB81((ulong)in_RDI >> 0x38,0));
      goto LAB_007130f5;
    }
  }
  MVar6 = MVar5;
  iVar2 = QTextCursor::position();
  iVar1 = (int)in_RDI;
  if ((int)MVar5 < iVar2) {
    MVar3 = QTextCursor::selectionEnd();
    QTextCursor::setPosition(iVar1 + 0x88,MVar3);
    QTextCursor::setPosition(iVar1 + 0x88,MVar6);
    forceEmitSelectionChanged = (undefined1)(MVar6 >> 0x18);
    QTextCursor::movePosition(iVar1 + 0x88,4,1);
  }
  else {
    in_stack_ffffffffffffffb0 = &in_RDI->cursor;
    MVar3 = QTextCursor::selectionStart();
    QTextCursor::setPosition((int)in_stack_ffffffffffffffb0,MVar3);
    QTextCursor::setPosition(iVar1 + 0x88,MVar6);
    forceEmitSelectionChanged = (undefined1)(MVar6 >> 0x18);
    QTextCursor::movePosition(iVar1 + 0x88,0xf,1);
    QTextCursor::movePosition(iVar1 + 0x88,0x11,1);
  }
  local_c.super_QFlagsStorage<Qt::TextInteractionFlag>.i =
       (QFlagsStorage<Qt::TextInteractionFlag>)
       QFlags<Qt::TextInteractionFlag>::operator&
                 ((QFlags<Qt::TextInteractionFlag> *)in_stack_ffffffffffffffb0,
                  in_stack_ffffffffffffffac);
  IVar4 = ::QFlags::operator_cast_to_unsigned_int((QFlags *)&local_c);
  if (IVar4 != 0) {
    setClipboardSelection((QWidgetTextControlPrivate *)CONCAT44(in_stack_ffffffffffffffc4,MVar5));
    selectionChanged(this_01,(bool)forceEmitSelectionChanged);
  }
LAB_007130f5:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QWidgetTextControlPrivate::extendBlockwiseSelection(int suggestedNewPosition)
{
    Q_Q(QWidgetTextControl);

    // if inside the initial selected line keep that
    if (suggestedNewPosition >= selectedBlockOnTrippleClick.selectionStart()
        && suggestedNewPosition <= selectedBlockOnTrippleClick.selectionEnd()) {
        q->setTextCursor(selectedBlockOnTrippleClick);
        return;
    }

    if (suggestedNewPosition < selectedBlockOnTrippleClick.position()) {
        cursor.setPosition(selectedBlockOnTrippleClick.selectionEnd());
        cursor.setPosition(suggestedNewPosition, QTextCursor::KeepAnchor);
        cursor.movePosition(QTextCursor::StartOfBlock, QTextCursor::KeepAnchor);
    } else {
        cursor.setPosition(selectedBlockOnTrippleClick.selectionStart());
        cursor.setPosition(suggestedNewPosition, QTextCursor::KeepAnchor);
        cursor.movePosition(QTextCursor::EndOfBlock, QTextCursor::KeepAnchor);
        cursor.movePosition(QTextCursor::NextCharacter, QTextCursor::KeepAnchor);
    }

    if (interactionFlags & Qt::TextSelectableByMouse) {
#ifndef QT_NO_CLIPBOARD
        setClipboardSelection();
#endif
        selectionChanged(true);
    }
}